

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int lodOffsNdx;
  long lVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  uint uVar46;
  float fVar47;
  uint uVar49;
  float fVar50;
  undefined1 auVar48 [16];
  float fVar51;
  Texture2DView TVar52;
  Vec2 lodO;
  Vec4 resPix;
  Vec3 triT [2];
  Vec2 lodBounds;
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture2DView src;
  Vec2 clampedLod;
  float local_2a4;
  undefined1 local_298 [16];
  Vec2 local_288;
  float local_27c;
  undefined1 local_278 [16];
  Vec4 local_268;
  float local_258 [6];
  PixelBufferAccess *local_240;
  ReferenceParams *local_238;
  ulong local_230;
  float local_228;
  undefined8 local_224;
  float local_21c;
  float local_218;
  float local_214;
  undefined1 local_208 [8];
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  Sampler *local_150;
  ConstPixelBufferAccess *local_148;
  Vec2 local_140;
  float local_138;
  float fStack_134;
  float afStack_130 [2];
  undefined8 local_128;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  Texture2DView local_d8;
  undefined1 local_c8 [4];
  float fStack_c4;
  ConstPixelBufferAccess *pCStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  tcu local_38 [8];
  undefined1 auVar34 [16];
  
  local_1f8 = 0.0;
  fStack_1f4 = 0.0;
  uStack_1f0 = 0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar6 = sampleParams->baseLevel;
  iVar8 = baseView->m_numLevels + -1;
  iVar11 = iVar8;
  if (iVar6 < iVar8) {
    iVar11 = iVar6;
  }
  iVar9 = 0;
  if (-1 < iVar6) {
    iVar9 = iVar11;
  }
  iVar6 = sampleParams->maxLevel;
  if (iVar6 < iVar8) {
    iVar8 = iVar6;
  }
  iVar11 = 1;
  if (iVar9 <= iVar6) {
    iVar11 = (iVar8 - iVar9) + 1;
  }
  pCStack_c0 = baseView->m_levels + iVar9;
  local_c8 = (undefined1  [4])iVar11;
  local_150 = &sampleParams->sampler;
  local_240 = errorMask;
  local_148 = reference;
  TVar52 = tcu::getEffectiveTextureView((Texture2DView *)local_c8,&local_118,local_150);
  local_d8.m_levels = TVar52.m_levels;
  local_d8.m_numLevels = TVar52.m_numLevels;
  local_228 = *texCoord;
  local_258[0] = texCoord[1];
  local_224._0_4_ = texCoord[2];
  local_224._4_4_ = texCoord[4];
  local_21c = texCoord[6];
  local_258[1] = texCoord[3];
  local_258[2] = texCoord[5];
  local_258[3] = texCoord[7];
  fVar26 = 0.0;
  if (0 < local_d8.m_numLevels) {
    uVar2 = *(undefined8 *)((local_d8.m_levels)->m_size).m_data;
    local_1f8 = (float)(int)uVar2;
    fStack_1f4 = (float)(int)((ulong)uVar2 >> 0x20);
    uStack_1f0 = 0;
  }
  fVar40 = (float)(result->m_size).m_data[0];
  fVar41 = (float)(result->m_size).m_data[1];
  local_138 = (sampleParams->super_RenderParams).w.m_data[0];
  fStack_134 = (sampleParams->super_RenderParams).w.m_data[1];
  afStack_130[0] = (sampleParams->super_RenderParams).w.m_data[2];
  afStack_130[1] = (sampleParams->super_RenderParams).w.m_data[3];
  local_128 = CONCAT44(fStack_134,afStack_130[0]);
  _local_208 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    _local_208 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_c8 = (undefined1  [4])0xbf800000;
  fStack_c4 = 0.0;
  pCStack_c0 = (ConstPixelBufferAccess *)0x3f800000;
  local_b8 = 0xbf80000000000000;
  uStack_b0 = 0x3f80000000000000;
  local_298._0_4_ = 0xff00ff00;
  local_258[4] = local_258[2];
  local_258[5] = local_258[1];
  local_218 = local_224._4_4_;
  local_214 = (float)local_224;
  tcu::RGBA::toVec((RGBA *)local_298);
  tcu::clear(local_240,&local_268);
  if ((result->m_size).m_data[1] < 1) {
    iVar6 = 0;
  }
  else {
    local_208._4_4_ = local_208._0_4_;
    uStack_200 = local_208._0_4_;
    uStack_1fc = local_208._0_4_;
    local_e8._4_4_ = fStack_1f4;
    local_e8._0_4_ = fStack_1f4;
    local_e8._8_4_ = fStack_1f4;
    local_e8._12_4_ = fStack_1f4;
    iVar6 = 0;
    iVar11 = 0;
    local_238 = sampleParams;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar17 = (float)iVar11 + 0.5;
        local_27c = fVar41 - fVar17;
        local_f8 = ZEXT416((uint)(fVar17 / fVar41));
        local_a8 = ZEXT416((uint)(1.0 - fVar17 / fVar41));
        iVar8 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_298,(int)result,iVar8,iVar11);
          auVar14._0_4_ =
               (float)local_298._0_4_ - (sampleParams->super_RenderParams).colorBias.m_data[0];
          auVar14._4_4_ =
               (float)local_298._4_4_ - (sampleParams->super_RenderParams).colorBias.m_data[1];
          auVar14._8_4_ =
               (float)local_298._8_4_ - (sampleParams->super_RenderParams).colorBias.m_data[2];
          auVar14._12_4_ =
               (float)local_298._12_4_ - (sampleParams->super_RenderParams).colorBias.m_data[3];
          local_268.m_data =
               (float  [4])
               divps(auVar14,*(undefined1 (*) [16])
                              (sampleParams->super_RenderParams).colorScale.m_data);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_298,(int)local_148,iVar8,iVar11);
          auVar15._0_4_ =
               (float)local_298._0_4_ - (sampleParams->super_RenderParams).colorBias.m_data[0];
          auVar15._4_4_ =
               (float)local_298._4_4_ - (sampleParams->super_RenderParams).colorBias.m_data[1];
          auVar15._8_4_ =
               (float)local_298._8_4_ - (sampleParams->super_RenderParams).colorBias.m_data[2];
          auVar15._12_4_ =
               (float)local_298._12_4_ - (sampleParams->super_RenderParams).colorBias.m_data[3];
          auVar14 = divps(auVar15,*(undefined1 (*) [16])
                                   (sampleParams->super_RenderParams).colorScale.m_data);
          auVar18._0_4_ = local_268.m_data[0] - auVar14._0_4_;
          auVar18._4_4_ = local_268.m_data[1] - auVar14._4_4_;
          auVar18._8_4_ = local_268.m_data[2] - auVar14._8_4_;
          auVar18._12_4_ = local_268.m_data[3] - auVar14._12_4_;
          uVar7 = CONCAT44(auVar18._4_4_,auVar18._0_4_);
          auVar44._0_8_ = uVar7 ^ 0x8000000080000000;
          auVar44._8_4_ = -auVar18._8_4_;
          auVar44._12_4_ = -auVar18._12_4_;
          auVar15 = maxps(auVar44,auVar18);
          auVar14 = *(undefined1 (*) [16])(lookupPrec->colorThreshold).m_data;
          auVar16._4_4_ = -(uint)(auVar15._4_4_ <= auVar14._4_4_);
          auVar16._0_4_ = -(uint)(auVar15._0_4_ <= auVar14._0_4_);
          auVar16._8_4_ = -(uint)(auVar15._8_4_ <= auVar14._8_4_);
          auVar16._12_4_ = -(uint)(auVar15._12_4_ <= auVar14._12_4_);
          auVar14 = packssdw(auVar16,auVar16);
          auVar14 = packsswb(auVar14,auVar14);
          local_298._0_4_ = SUB164(auVar14 & _DAT_00ae46a0,0);
          if (SUB161(auVar14 & _DAT_00ae46a0,0) == '\0') {
LAB_009ad557:
            fVar24 = (float)iVar8 + 0.5;
            fVar27 = fVar24 / fVar40;
            bVar5 = 1.0 <= (float)local_f8._0_4_ + fVar27;
            fVar12 = fVar17;
            local_2a4 = fVar24;
            if (bVar5) {
              fVar12 = local_27c;
              local_2a4 = fVar40 - fVar24;
            }
            lVar10 = (ulong)((uint)bVar5 * 4) * 3;
            fVar22 = *(float *)((long)local_258 + lVar10);
            fVar23 = *(float *)((long)local_258 + lVar10 + 4);
            fVar25 = *(float *)((long)local_258 + lVar10 + 8);
            uVar7 = *(ulong *)((long)&local_138 + lVar10);
            fVar51 = (float)uVar7;
            fStack_64 = (float)(uVar7 >> 0x20);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = *(ulong *)((long)afStack_130 + lVar10 + -4);
            uVar46 = (int)((uint)bVar5 << 0x1f) >> 0x1f;
            uVar49 = (int)((uint)bVar5 << 0x1f) >> 0x1f;
            auVar30._0_4_ = local_a8._0_4_ & uVar46;
            auVar30._4_4_ = (uint)(1.0 - fVar27) & uVar49;
            auVar30._8_8_ = 0;
            auVar48._0_4_ = ~uVar46 & local_f8._0_4_;
            auVar48._4_4_ = ~uVar49 & (uint)fVar27;
            auVar48._8_4_ = local_f8._8_4_;
            auVar48._12_4_ = local_f8._12_4_;
            auVar48 = auVar48 | auVar30;
            fVar47 = auVar48._0_4_;
            fVar50 = auVar48._4_4_;
            fVar36 = auVar48._8_4_;
            fVar21 = auVar48._12_4_;
            fVar35 = (1.0 - fVar50) - fVar47;
            auVar14 = divps(auVar48,auVar42);
            auVar31._4_4_ = auVar14._4_4_;
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._4_4_;
            auVar31._12_4_ = auVar31._4_4_;
            auVar32._4_12_ = auVar31._4_12_;
            auVar32._0_4_ = auVar31._4_4_ + fVar35 / fVar51 + auVar14._0_4_;
            fVar13 = (float)*(undefined8 *)((long)&local_224 + lVar10);
            local_1b8._4_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&local_224 + lVar10) >> 0x20);
            auVar19._0_4_ = fVar13 * fVar47;
            auVar19._4_4_ = fVar22 * fVar35;
            auVar19._8_4_ = fVar36 * 0.0;
            auVar19._12_4_ = fVar21 * 0.0;
            fVar27 = *(float *)((long)&local_228 + lVar10);
            auVar43._0_4_ = fVar27 * fVar35;
            auVar43._4_4_ = fVar23 * fVar47;
            auVar43._8_4_ = fVar36 * 0.0;
            auVar43._12_4_ = fVar21 * 0.0;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar7;
            auVar44 = divps(auVar43,auVar4);
            auVar3._4_4_ = fVar51;
            auVar3._0_4_ = fStack_64;
            auVar3._8_8_ = 0;
            auVar14 = divps(auVar19,auVar3);
            auVar28._0_4_ = (float)local_1b8._4_4_ * fVar50;
            auVar28._4_4_ = fVar25 * fVar50;
            auVar28._8_4_ = (float)local_1b8._4_4_ * fVar50;
            auVar28._12_4_ = (float)local_1b8._4_4_ * fVar50;
            fVar35 = *(float *)((long)afStack_130 + lVar10);
            auVar20._4_4_ = fVar35;
            auVar20._0_4_ = fVar35;
            auVar20._8_8_ = 0;
            auVar15 = divps(auVar28,auVar20);
            auVar29._0_4_ = auVar15._0_4_ + auVar44._0_4_ + auVar14._0_4_;
            auVar29._4_4_ = auVar15._4_4_ + auVar44._4_4_ + auVar14._4_4_;
            auVar29._8_4_ = auVar15._8_4_ + auVar44._8_4_ + auVar14._8_4_;
            auVar29._12_4_ = auVar15._12_4_ + auVar44._12_4_ + auVar14._12_4_;
            auVar34._0_8_ = auVar32._0_8_;
            auVar34._8_4_ = auVar31._4_4_;
            auVar34._12_4_ = auVar31._4_4_;
            auVar33._8_8_ = auVar34._8_8_;
            auVar33._4_4_ = auVar32._0_4_;
            auVar33._0_4_ = auVar32._0_4_;
            auVar14 = divps(auVar29,auVar33);
            local_140.m_data = auVar14._0_8_;
            fVar45 = fVar47 + -1.0;
            local_48 = ZEXT416((uint)(fVar35 * fVar40));
            local_1a8 = fVar35 * fVar40 * fVar47 + fVar24 * fStack_64;
            fStack_1a4 = (fVar13 - fVar27) * fVar35 + ((float)local_1b8._4_4_ - fVar13) * fVar51;
            fStack_1a0 = fVar36 * 0.0 + fVar26 * 0.0;
            fStack_19c = (float)local_1b8._4_4_ * fVar21 + (float)local_1b8._4_4_ * 0.0;
            local_58 = -fVar51;
            fStack_54 = -fStack_64;
            local_198 = fVar35 * fStack_64;
            fStack_194 = (fVar27 - (float)local_1b8._4_4_) * fStack_64;
            fStack_190 = fStack_64 * 0.0;
            fStack_18c = fStack_64 * 0.0;
            uStack_50 = 0x80000000;
            uStack_4c = 0x80000000;
            fVar36 = (fVar40 * fVar45 + fVar24) * local_198 + local_58 * local_1a8;
            local_68 = fStack_64 * fVar41;
            fVar24 = fVar51 * fStack_64 * fVar35;
            local_88._0_4_ = fVar24 * fVar40;
            local_88._4_4_ = fStack_64;
            local_88._8_8_ = 0;
            fVar36 = fVar36 * fVar36;
            fVar37 = (fVar23 - fVar22) * fVar35 + (fVar25 - fVar23) * fVar51;
            fVar38 = (fVar22 - fVar25) * fStack_64;
            local_178 = ZEXT416((uint)fVar37);
            local_168 = ZEXT416((uint)fVar38);
            fVar21 = fVar50 + -1.0;
            fVar39 = (fVar41 * fVar21 + fVar17) * local_198 -
                     (local_68 * fVar50 + fVar17 * fVar35) * fVar51;
            local_1b8._0_4_ =
                 (fVar13 - (float)local_1b8._4_4_) * fVar51 +
                 ((float)local_1b8._4_4_ - fVar27) * fStack_64;
            fVar27 = (fVar27 - fVar13) * fVar35;
            local_1b8._8_8_ = 0;
            local_78 = ZEXT416((uint)fVar27);
            fStack_1d4 = fStack_64;
            local_1d8 = fStack_64;
            fStack_1d0 = fStack_64;
            fStack_1cc = fStack_64;
            fVar26 = (fVar23 - fVar25) * fVar51 + (fVar25 - fVar22) * fStack_64;
            local_1c8 = ZEXT416((uint)fVar35);
            fVar35 = (fVar22 - fVar23) * fVar35;
            local_278 = ZEXT416((uint)fVar26);
            local_188 = ZEXT416((uint)fVar35);
            local_1e8._0_4_ = fVar24 * fVar41;
            local_1e8._4_8_ = uVar7 >> 0x20;
            local_1e8._12_4_ = 0;
            fVar39 = fVar39 * fVar39;
            fStack_60 = fStack_64;
            fStack_5c = fStack_64;
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_230,
                       (((float)local_88._0_4_ * (fVar45 * fStack_194 + fVar47 * fStack_1a4)) /
                       fVar36) * local_1f8,
                       (((fVar45 * fVar38 + fVar47 * fVar37) * (float)local_88._0_4_) / fVar36) *
                       (float)local_e8._0_4_,
                       (((fVar27 * fVar21 + fVar50 * (float)local_1b8._0_4_) *
                        (float)local_1e8._0_4_) / fVar39) * local_1f8,
                       (((fVar21 * fVar35 + fVar50 * fVar26) * (float)local_1e8._0_4_) / fVar39) *
                       (float)local_e8._0_4_,lodPrec);
            local_98 = fStack_194;
            fStack_94 = fStack_194;
            fStack_90 = fStack_194;
            fStack_8c = fStack_194;
            lVar10 = 0;
            local_1a8 = fStack_1a4;
            fStack_1a0 = fStack_1a4;
            fStack_19c = fStack_1a4;
            do {
              fVar26 = *(float *)(local_c8 + lVar10 * 8) + local_2a4;
              fVar27 = *(float *)(local_c8 + lVar10 * 8 + 4) + fVar12;
              fVar25 = fVar26 / fVar40;
              fVar35 = fVar27 / fVar41;
              fVar24 = fVar35 + -1.0;
              fVar22 = (fVar40 * fVar24 + fVar26) * local_198 +
                       ((float)local_48._0_4_ * fVar35 + fVar26 * local_1d8) * local_58;
              fVar22 = fVar22 * fVar22;
              fVar23 = fVar25 + -1.0;
              fVar27 = (fVar41 * fVar23 + fVar27) * local_198 +
                       (local_68 * fVar25 + fVar27 * (float)local_1c8._0_4_) * local_58;
              fVar27 = fVar27 * fVar27;
              fVar26 = fStack_1f4;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_298,
                         (((local_98 * fVar24 + local_1a8 * fVar35) * (float)local_88._0_4_) /
                         fVar22) * local_1f8,
                         (((fVar24 * (float)local_168._0_4_ + fVar35 * (float)local_178._0_4_) *
                          (float)local_88._0_4_) / fVar22) * (float)local_e8._0_4_,
                         ((((float)local_78._0_4_ * fVar23 + (float)local_1b8._0_4_ * fVar25) *
                          (float)local_1e8._0_4_) / fVar27) * local_1f8,
                         (((fVar23 * (float)local_188._0_4_ + fVar25 * (float)local_278._0_4_) *
                          (float)local_1e8._0_4_) / fVar27) * (float)local_e8._0_4_,lodPrec);
              fVar24 = (float)(local_230 >> 0x20);
              uVar46 = -(uint)((float)local_230 <= (float)local_298._0_8_);
              uVar49 = -(uint)(SUB84(local_298._0_8_,4) <= fVar24);
              local_230 = CONCAT44(~uVar49 & (uint)SUB84(local_298._0_8_,4),
                                   ~uVar46 & (uint)(float)local_298._0_8_) |
                          CONCAT44((uint)fVar24 & uVar49,(uint)(float)local_230 & uVar46);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_298._0_4_ = (float)local_230 + (float)local_208._0_4_;
            local_298._4_4_ = (float)(local_230 >> 0x20) + (float)local_208._4_4_;
            local_288.m_data[0] = local_238->minLod;
            local_288.m_data[1] = local_238->maxLod;
            tcu::clampLodBounds(local_38,(Vec2 *)local_298,&local_288,lodPrec);
            bVar5 = tcu::isLookupResultValid
                              (&local_d8,local_150,lookupPrec,&local_140,(Vec2 *)local_38,&local_268
                              );
            sampleParams = local_238;
            if (!bVar5) {
              local_288.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_288);
              tcu::PixelBufferAccess::setPixel(local_240,(Vec4 *)local_298,iVar8,iVar11,0);
              iVar6 = iVar6 + 1;
              sampleParams = local_238;
            }
          }
          else {
            uVar7 = 0xffffffffffffffff;
            do {
              if (uVar7 == 2) goto LAB_009adce7;
              uVar1 = uVar7 + 1;
              lVar10 = uVar7 + 2;
              uVar7 = uVar1;
            } while (local_298[lVar10] != '\0');
            if (uVar1 < 3) goto LAB_009ad557;
          }
LAB_009adce7:
          iVar8 = iVar8 + 1;
        } while (iVar8 < (result->m_size).m_data[0]);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < (result->m_size).m_data[1]);
  }
  if (local_118.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture2DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec2							srcSize				= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}